

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O1

SyntaxListType * ctemplate::TemplateNamelist::GetBadSyntaxList_abi_cxx11_(bool refresh,Strip strip)

{
  bool bVar1;
  NameListType *pNVar2;
  MissingListType *pMVar3;
  Template *pTVar4;
  ostream *poVar5;
  _Hash_node_base *p_Var6;
  TemplateString local_50;
  
  if (bad_syntax_list__abi_cxx11_ ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bad_syntax_list__abi_cxx11_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)operator_new(0x18);
    (bad_syntax_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (bad_syntax_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (bad_syntax_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else if (!refresh) {
    return bad_syntax_list__abi_cxx11_;
  }
  pNVar2 = GetList_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(bad_syntax_list__abi_cxx11_);
  pMVar3 = GetMissingList_abi_cxx11_(true);
  p_Var6 = (pNVar2->_M_h)._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_50.ptr_ = (char *)p_Var6[1]._M_nxt;
      local_50.length_ = (size_t)p_Var6[2]._M_nxt;
      local_50.is_immutable_ = false;
      local_50.id_ = 0;
      pTVar4 = Template::GetTemplate(&local_50,strip);
      if (pTVar4 == (Template *)0x0) {
        bVar1 = std::
                binary_search<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          ((pMVar3->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (pMVar3->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,(value_type *)(p_Var6 + 1));
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(bad_syntax_list__abi_cxx11_,(value_type *)(p_Var6 + 1));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR",5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error loading template: ",0x18);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)p_Var6[1]._M_nxt,(long)p_Var6[2]._M_nxt)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        }
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  return bad_syntax_list__abi_cxx11_;
}

Assistant:

const TemplateNamelist::SyntaxListType& TemplateNamelist::GetBadSyntaxList(
    bool refresh, Strip strip) {
  if (!bad_syntax_list_) {
    bad_syntax_list_ = new SyntaxListType;
    refresh = true;  // always refresh the first time
  }

  if (refresh) {
    const NameListType& the_list = TemplateNamelist::GetList();

    bad_syntax_list_->clear();

    const MissingListType& missing_list = GetMissingList(true);
    for (NameListType::const_iterator iter = the_list.begin();
         iter != the_list.end();
         ++iter) {
      Template *tpl = Template::GetTemplate((*iter), strip);
      if (!tpl) {
        if (!binary_search(missing_list.begin(), missing_list.end(), *iter)) {
          // If it's not in the missing list, then we're here because
          // it caused an error during parsing
          bad_syntax_list_->push_back(*iter);
          LOG(ERROR) << "Error loading template: " << (*iter) << "\n";
        }
      }
    }
  }
  return *bad_syntax_list_;
}